

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorUtils.hpp
# Opt level: O2

Result * CoreML::validateActivationParams(Result *__return_storage_ptr__,ActivationParams *params)

{
  uint uVar1;
  WeightParamType WVar2;
  WeightParamType WVar3;
  char *pcVar4;
  ulong uVar5;
  undefined1 *puVar6;
  string sStack_1c8;
  stringstream ss;
  ostream local_198 [376];
  
  uVar1 = params->_oneof_case_[0] - 10;
  uVar5 = (ulong)uVar1;
  if (uVar1 < 0x3e) {
    if ((0x10040100c0300421U >> (uVar5 & 0x3f) & 1) != 0) goto LAB_002b4958;
    if (uVar5 == 0xf) {
      puVar6 = (undefined1 *)((params->NonlinearityType_).prelu_)->alpha_;
      if ((WeightParams *)puVar6 == (WeightParams *)0x0) {
        puVar6 = Specification::_WeightParams_default_instance_;
      }
      WVar2 = valueType((WeightParams *)puVar6);
      if (WVar2 == UNSPECIFIED) {
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        std::operator<<(local_198,"Nonlinearity type ");
        pcVar4 = MLActivationParamsNonlinearityType_Name(params->_oneof_case_[0]);
        std::operator<<(local_198,pcVar4);
        std::operator<<(local_198," has inconsistent weight parameter types.");
        std::__cxx11::stringbuf::str();
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&sStack_1c8);
        goto LAB_002b4b6e;
      }
      goto LAB_002b4958;
    }
    if (uVar5 == 0x3d) {
      puVar6 = (undefined1 *)((params->NonlinearityType_).prelu_)->alpha_;
      if ((WeightParams *)puVar6 == (WeightParams *)0x0) {
        puVar6 = Specification::_WeightParams_default_instance_;
      }
      WVar2 = valueType((WeightParams *)puVar6);
      if (params->_oneof_case_[0] == 0x47) {
        puVar6 = (undefined1 *)(params->NonlinearityType_).parametricsoftplus_;
      }
      else {
        puVar6 = Specification::_ActivationParametricSoftplus_default_instance_;
      }
      puVar6 = (undefined1 *)((ActivationParametricSoftplus *)puVar6)->beta_;
      if ((WeightParams *)puVar6 == (WeightParams *)0x0) {
        puVar6 = Specification::_WeightParams_default_instance_;
      }
      WVar3 = valueType((WeightParams *)puVar6);
      if (WVar2 == WVar3) {
        if (params->_oneof_case_[0] == 0x47) {
          puVar6 = (undefined1 *)(params->NonlinearityType_).prelu_;
        }
        else {
          puVar6 = Specification::_ActivationParametricSoftplus_default_instance_;
        }
        puVar6 = (undefined1 *)((ActivationPReLU *)puVar6)->alpha_;
        if ((WeightParams *)puVar6 == (WeightParams *)0x0) {
          puVar6 = Specification::_WeightParams_default_instance_;
        }
        WVar2 = valueType((WeightParams *)puVar6);
        if (WVar2 != UNSPECIFIED) {
          if (params->_oneof_case_[0] == 0x47) {
            puVar6 = (undefined1 *)(params->NonlinearityType_).parametricsoftplus_;
          }
          else {
            puVar6 = Specification::_ActivationParametricSoftplus_default_instance_;
          }
          puVar6 = (undefined1 *)((ActivationParametricSoftplus *)puVar6)->beta_;
          if ((WeightParams *)puVar6 == (WeightParams *)0x0) {
            puVar6 = Specification::_WeightParams_default_instance_;
          }
          WVar2 = valueType((WeightParams *)puVar6);
          if (WVar2 != UNSPECIFIED) goto LAB_002b4958;
        }
      }
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      std::operator<<(local_198,"Nonlinearity type ");
      pcVar4 = MLActivationParamsNonlinearityType_Name(params->_oneof_case_[0]);
      std::operator<<(local_198,pcVar4);
      std::operator<<(local_198," has inconsistent weight parameter types.");
      std::__cxx11::stringbuf::str();
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&sStack_1c8);
      goto LAB_002b4b6e;
    }
  }
  if (params->_oneof_case_[0] != 5) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::operator<<(local_198,"Nonlinearity type ");
    pcVar4 = MLActivationParamsNonlinearityType_Name(params->_oneof_case_[0]);
    std::operator<<(local_198,pcVar4);
    std::operator<<(local_198," is not supported in this version of CoreML.");
    std::__cxx11::stringbuf::str();
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&sStack_1c8);
LAB_002b4b6e:
    std::__cxx11::string::~string((string *)&sStack_1c8);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    return __return_storage_ptr__;
  }
LAB_002b4958:
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

inline Result validateActivationParams(const Specification::ActivationParams& params) {
    // make sure params fall into expected values for non-recurrent activations
    switch (params.NonlinearityType_case()) {
        case Specification::ActivationParams::NonlinearityTypeCase::kReLU:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kLeakyReLU:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kTanh:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kScaledTanh:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kSigmoid:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kSigmoidHard:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kLinear:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kELU:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kSoftplus:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kPReLU:
        {
            if (valueType(params.prelu().alpha()) == UNSPECIFIED) {
                std::stringstream ss;
                ss << "Nonlinearity type ";
                ss << MLActivationParamsNonlinearityType_Name(static_cast<MLActivationParamsNonlinearityType>(params.NonlinearityType_case()));
                ss << " has inconsistent weight parameter types.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, ss.str());
            }
            break;
        }
        case Specification::ActivationParams::NonlinearityTypeCase::kParametricSoftplus:
        {
            if (valueType(params.parametricsoftplus().alpha()) != valueType(params.parametricsoftplus().beta()) ||
                valueType(params.parametricsoftplus().alpha()) == UNSPECIFIED ||
                valueType(params.parametricsoftplus().beta()) == UNSPECIFIED) {
                std::stringstream ss;
                ss << "Nonlinearity type ";
                ss << MLActivationParamsNonlinearityType_Name(static_cast<MLActivationParamsNonlinearityType>(params.NonlinearityType_case()));
                ss << " has inconsistent weight parameter types.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, ss.str());
            }
            break;
        }
        case Specification::ActivationParams::NonlinearityTypeCase::kThresholdedReLU:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kSoftsign:
            break;
        default:
        {
            std::stringstream ss;
            ss << "Nonlinearity type ";
            ss << MLActivationParamsNonlinearityType_Name(static_cast<MLActivationParamsNonlinearityType>(params.NonlinearityType_case()));
            ss << " is not supported in this version of CoreML.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, ss.str());
        }
    }
    return Result();
}